

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::GenerateSmoothingPoints
          (DeadReckoningCalculator *this,WorldCoordinates *StartPosition,
          WorldCoordinates *EndPosition,KUINT32 NumberOfPoints,
          vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
          *v)

{
  KFLOAT64 this_00;
  WorldCoordinates local_98;
  WorldCoordinates local_78;
  uint local_54;
  undefined1 local_50 [4];
  KINT32 i;
  WorldCoordinates delta_loc;
  vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  *v_local;
  KUINT32 NumberOfPoints_local;
  WorldCoordinates *EndPosition_local;
  WorldCoordinates *StartPosition_local;
  DeadReckoningCalculator *this_local;
  
  delta_loc.m_f64Z = (KFLOAT64)v;
  std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
  ::reserve(v,(ulong)NumberOfPoints);
  DATA_TYPE::WorldCoordinates::operator-((WorldCoordinates *)local_50,EndPosition,StartPosition);
  for (local_54 = 1; this_00 = delta_loc.m_f64Z, local_54 <= NumberOfPoints; local_54 = local_54 + 1
      ) {
    DATA_TYPE::WorldCoordinates::operator*
              (&local_98,(WorldCoordinates *)local_50,
               (KFLOAT32)((float)(int)local_54 / (float)NumberOfPoints));
    DATA_TYPE::WorldCoordinates::operator+(&local_78,StartPosition,&local_98);
    std::
    vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>::
    push_back((vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
               *)this_00,&local_78);
    DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_78);
    DATA_TYPE::WorldCoordinates::~WorldCoordinates(&local_98);
  }
  DATA_TYPE::WorldCoordinates::~WorldCoordinates((WorldCoordinates *)local_50);
  return;
}

Assistant:

void DeadReckoningCalculator::GenerateSmoothingPoints( const WorldCoordinates & StartPosition, const WorldCoordinates & EndPosition,
                                                       KUINT32 NumberOfPoints, vector<WorldCoordinates> & v)
{
    v.reserve( NumberOfPoints );
    WorldCoordinates delta_loc = EndPosition - StartPosition;

    for( KINT32 i = 1; i <= NumberOfPoints; ++i )
    {
        v.push_back( StartPosition + ( delta_loc *  ( KFLOAT32( i ) / KFLOAT32( NumberOfPoints ) ) ) );
    }
}